

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O2

MENU * updateMenu(MENU *menu,WINDOW *win,SatLookAngles *sats,ITEM **items,string *itemStrs,
                 bool updatePositions)

{
  uint uVar1;
  long lVar2;
  SatLookAngle *pSVar3;
  SatLookAngle *pSVar4;
  ostream *poVar5;
  ITEM *pIVar6;
  MENU *pMVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong index;
  undefined3 in_register_00000089;
  int local_290;
  int local_28c;
  ITEM *local_280;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8 [32];
  stringstream ss;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  if (CONCAT31(in_register_00000089,updatePositions) != 0) {
    SatLookAngles::updateTimeAndPositions(sats);
    SatLookAngles::sort(sats);
  }
  if (win == (WINDOW *)0x0) {
    local_28c = -3;
    local_290 = -6;
  }
  else {
    local_290 = win->_maxy + -4;
    local_28c = win->_maxx + -1;
  }
  local_280 = (ITEM *)current_item();
  uVar1 = item_index(local_280);
  index = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = index;
  }
  while( true ) {
    lVar2 = (long)(sats->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sats->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(lVar2 / 0xf8) <= index) break;
    pSVar3 = SatLookAngles::operator[](sats,index);
    pSVar4 = SatLookAngles::operator[](sats,index);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 10;
    std::__cxx11::to_string(&local_258,index);
    poVar5 = std::operator<<((ostream *)local_1a8,(string *)&local_258);
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x19;
    std::__cxx11::string::string(local_1d8,(string *)pSVar3);
    poVar5 = std::operator<<(poVar5,local_1d8);
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    std::__cxx11::to_string(&local_218,((pSVar4->second).azimuth * 180.0) / 3.141592653589793);
    poVar5 = std::operator<<(poVar5,(string *)&local_218);
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    std::__cxx11::to_string(&local_238,((pSVar4->second).elevation * 180.0) / 3.141592653589793);
    poVar5 = std::operator<<(poVar5,(string *)&local_238);
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xc;
    std::__cxx11::to_string(&local_1f8,(pSVar4->second).range);
    std::operator<<(poVar5,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)itemStrs,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    if (items[index] != (ITEM *)0x0) {
      free_item();
    }
    pIVar6 = (ITEM *)new_item((itemStrs->_M_dataplus)._M_p,0);
    items[index] = pIVar6;
    if (uVar8 == index) {
      local_280 = pIVar6;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    index = index + 1;
    itemStrs = itemStrs + 1;
  }
  if (menu != (MENU *)0x0) {
    unpost_menu(menu,0xf8,lVar2 % 0xf8);
    free_menu(menu);
  }
  pMVar7 = (MENU *)new_menu(items);
  set_menu_mark(pMVar7,"->");
  uVar8 = ((long)(sats->_sats).
                 super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(sats->_sats).
                super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xf8;
  if ((ulong)(long)local_290 <= uVar8) {
    uVar8 = (long)local_290;
  }
  set_menu_format(pMVar7,uVar8 & 0xffffffff,1);
  set_menu_win(pMVar7,win);
  uVar9 = derwin(win,local_290,local_28c,2,1);
  set_menu_sub(pMVar7,uVar9);
  set_current_item(pMVar7,local_280);
  post_menu(pMVar7);
  return pMVar7;
}

Assistant:

static MENU *updateMenu(MENU *menu, WINDOW *win, SatLookAngles &sats,
                        ITEM **items, std::string *itemStrs,
                        bool updatePositions) {
  if (updatePositions) {
    sats.updateTimeAndPositions();
    sats.sort();
  }

  int rows, cols;
  getmaxyx(win, rows, cols);

  // Remember cursor position so we can restore it.
  ITEM *curItem = current_item(menu);
  int curIdx = item_index(curItem);
  if (curIdx < 0)
    curIdx = 0;

  // Create the strings (items) for the menu.
  for (size_t i = 0; i < sats.size(); ++i) {
    const auto &tle = sats[i].first;
    const auto &la = sats[i].second;
    std::stringstream ss;
    ss << std::left << std::setw(10) << std::to_string(i) << std::setw(25)
       << tle.Name() << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.azimuth)) << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.elevation)) << std::setw(12)
       << std::to_string(la.range);
    itemStrs[i] = ss.str();
    if (items[i])
      free_item(items[i]);
    items[i] = new_item(itemStrs[i].c_str(), nullptr);

    if (i == (size_t)curIdx)
      curItem = items[i]; // Updated item at cursor position.
  }

  // Rebuild the menu (freeing the previous one).
  if (menu) {
    unpost_menu(menu);
    free_menu(menu);
  }
  menu = new_menu(items);
  set_menu_mark(menu, "->");
  set_menu_format(menu, std::min(sats.size(), (size_t)rows - 5), 1);
  set_menu_win(menu, win);
  set_menu_sub(menu, derwin(win, rows - 5, cols - 2, 2, 1));
  set_current_item(menu, curItem);
  post_menu(menu);
  return menu;
}